

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_driver.cc
# Opt level: O2

void test_61(QPDF *pdf,char *arg2)

{
  long lVar1;
  ExtendNameTree *this;
  allocator<char> local_1a2;
  allocator<char> local_1a1;
  QPDFObjectHandle local_1a0;
  Pl_Discard pd;
  string local_160 [32];
  string local_140 [32];
  string local_120 [32];
  BufferInputSource b;
  
  QPDF::setAttemptRecovery(SUB81(pdf,0));
  QPDF::setSuppressWarnings(SUB81(pdf,0));
  QPDF::processMemoryFile((char *)pdf,"empty",0x13d83c,(char *)0x0);
  QUtil::safe_fopen("/does/not/exist","r");
  QUtil::int_to_string_base_abi_cxx11_((longlong)local_120,0,0xc);
  std::__cxx11::string::~string(local_120);
  QUtil::toUTF8_abi_cxx11_((ulong)local_140);
  std::__cxx11::string::~string(local_140);
  std::__cxx11::string::string<std::allocator<char>>((string *)&pd,"x",&local_1a1);
  std::__cxx11::string::string<std::allocator<char>>(local_160,"y",&local_1a2);
  BufferInputSource::BufferInputSource(&b,(string *)&pd,local_160);
  std::__cxx11::string::~string(local_160);
  std::__cxx11::string::~string((string *)&pd);
  lVar1 = __dynamic_cast(&b,&InputSource::typeinfo,&BufferInputSource::typeinfo,0);
  if (lVar1 == 0) {
    __assert_fail("dynamic_cast<BufferInputSource*>(is) != nullptr",
                  "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc"
                  ,0x8dd,"void test_61(QPDF &, const char *)");
  }
  Pl_Discard::Pl_Discard(&pd);
  lVar1 = __dynamic_cast(&pd,&Pipeline::typeinfo,&Pl_Discard::typeinfo,0);
  if (lVar1 != 0) {
    this = (ExtendNameTree *)operator_new(0x38);
    QPDFObjectHandle::newNull();
    ExtendNameTree::ExtendNameTree(this,&local_1a0,pdf);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_1a0.super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    (**(code **)(*(long *)this + 8))(this);
    Pl_Discard::~Pl_Discard(&pd);
    BufferInputSource::~BufferInputSource(&b);
    return;
  }
  __assert_fail("dynamic_cast<Pl_Discard*>(p) != nullptr",
                "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc",
                0x8e0,"void test_61(QPDF &, const char *)");
}

Assistant:

static void
test_61(QPDF& pdf, char const* arg2)
{
    // Test to make sure type information is passed across shared
    // library boundaries. This includes exception handling, dynamic
    // cast, and subclassing.
    pdf.setAttemptRecovery(false);
    pdf.setSuppressWarnings(true);
    try {
        pdf.processMemoryFile("empty", "", 0);
    } catch (QPDFExc const&) {
        std::cout << "Caught QPDFExc as expected" << std::endl;
    }
    try {
        QUtil::safe_fopen("/does/not/exist", "r");
    } catch (QPDFSystemError const&) {
        std::cout << "Caught QPDFSystemError as expected" << std::endl;
    }
    try {
        QUtil::int_to_string_base(0, 12);
    } catch (std::logic_error const&) {
        std::cout << "Caught logic_error as expected" << std::endl;
    }
    try {
        QUtil::toUTF8(0xffffffff);
    } catch (std::runtime_error const&) {
        std::cout << "Caught runtime_error as expected" << std::endl;
    }

    // Spot check RTTI for dynamic cast. We intend to have pipelines
    // and input sources be testable, but adding comprehensive tests
    // for everything doesn't add value as it wouldn't catch
    // forgetting QPDF_DLL_CLASS on a new subclass.
    BufferInputSource b("x", "y");
    InputSource* is = &b;
    assert(dynamic_cast<BufferInputSource*>(is) != nullptr);
    Pl_Discard pd;
    Pipeline* p = &pd;
    assert(dynamic_cast<Pl_Discard*>(p) != nullptr);

    // For some reason, QPDFNameTreeObjectHelper's vtable seems to
    // like to not make it into the shared library with mingw. Try to
    // make sure this is really fixed.
    QPDFNameTreeObjectHelper* n = new ExtendNameTree(QPDFObjectHandle::newNull(), pdf);
    delete n;
}